

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_mla(DisasContext_conflict1 *s,arg_s_rrrr *a,_Bool add)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar2;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *pTVar3;
  undefined7 in_register_00000011;
  TCGv_i32 var;
  uintptr_t o;
  TCGv_i32 pTVar4;
  TCGContext_conflict1 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rn;
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)a1 - (long)s_00);
  load_reg_var(s,var,iVar1);
  iVar1 = a->rm;
  pTVar2 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
  pTVar4 = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  load_reg_var(s,pTVar4,iVar1);
  pTVar3 = (TCGTemp *)(pTVar4 + (long)s_00);
  tcg_gen_op3_aarch64(s_00,INDEX_op_mul_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)pTVar3);
  tcg_temp_free_internal_aarch64(s_00,pTVar3);
  if ((int)CONCAT71(in_register_00000011,add) != 0) {
    iVar1 = a->ra;
    pTVar2 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
    load_reg_var(s,pTVar4,iVar1);
    pTVar3 = (TCGTemp *)(pTVar4 + (long)s_00);
    tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)pTVar3);
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
  }
  if (a->s != 0) {
    if (s_00->cpu_NF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),(TCGArg)a1);
    }
    if (s_00->cpu_ZF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_ZF + (long)s_00),(TCGArg)a1);
    }
  }
  store_reg(s,a->rd,var);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_mla(DisasContext *s, arg_s_rrrr *a, bool add)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_mul_i32(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    if (add) {
        t2 = load_reg(s, a->ra);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    if (a->s) {
        gen_logic_CC(tcg_ctx, t1);
    }
    store_reg(s, a->rd, t1);
    return true;
}